

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.h
# Opt level: O1

void __thiscall
CIF::UnitCell::UnitCell
          (UnitCell *this,CellGeometry *geo,
          vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *sites)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = geo->a;
  dVar2 = geo->b;
  dVar3 = geo->c;
  dVar4 = geo->alpha;
  dVar5 = geo->gamma;
  (this->geometry).beta = geo->beta;
  (this->geometry).gamma = dVar5;
  (this->geometry).c = dVar3;
  (this->geometry).alpha = dVar4;
  (this->geometry).a = dVar1;
  (this->geometry).b = dVar2;
  std::vector<double,_std::allocator<double>_>::vector(&(this->geometry).avec,&geo->avec);
  std::vector<double,_std::allocator<double>_>::vector(&(this->geometry).bvec,&geo->bvec);
  std::vector<double,_std::allocator<double>_>::vector(&(this->geometry).cvec,&geo->cvec);
  std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::vector(&this->atoms,sites);
  return;
}

Assistant:

UnitCell(CellGeometry geo, std::vector<AtomSite> sites) : geometry(geo), atoms(sites) {}